

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_module(lysp_yang_ctx *ctx,lysp_module *mod)

{
  lysp_ext_instance **exts;
  lysp_node **siblings;
  lys_module *plVar1;
  lyd_node *plVar2;
  LY_ERR LVar3;
  lysp_submodule *plVar4;
  uint32_t parent_stmt_index;
  char *format;
  ly_stmt lVar5;
  LY_VECODE code;
  ly_ctx *plVar6;
  lysp_module *plVar7;
  ly_stmt stmt;
  char **value;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  bool bVar11;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  undefined4 in_stack_ffffffffffffff40;
  ly_stmt in_stack_ffffffffffffff44;
  char *local_a8;
  size_t local_a0;
  lysp_include **local_98;
  lysp_import **local_90;
  lysp_node_augment **local_88;
  lysp_deviation **local_80;
  lysp_ext **local_78;
  lysp_feature **local_70;
  lysp_node_grp **local_68;
  lysp_ident **local_60;
  lysp_node_notif **local_58;
  lysp_node_action **local_50;
  lysp_tpdf **local_48;
  lysp_revision **local_40;
  char *local_38;
  
  mod->field_0x79 = mod->field_0x79 & 0xfd;
  LVar3 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_a8,&local_38,&local_a0);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  if (local_38 == (char *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar9 = local_a8;
    if (local_a0 == 0) {
      pcVar9 = "";
    }
    LVar3 = lydict_insert(plVar6,pcVar9,local_a0,&mod->mod->name);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar3 = lydict_insert_zc(plVar6,local_a8,&mod->mod->name);
  }
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff44,&local_a8,&local_a0);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  if (in_stack_ffffffffffffff44 != LY_STMT_SYNTAX_SEMICOLON) {
    if (in_stack_ffffffffffffff44 != LY_STMT_SYNTAX_LEFT_BRACE) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar9 = lyplg_ext_stmt2str(in_stack_ffffffffffffff44);
      ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\"."
              ,pcVar9);
      return LY_EVALID;
    }
    LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff44,&local_a8,&local_a0);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    if (in_stack_ffffffffffffff44 != LY_STMT_SYNTAX_RIGHT_BRACE) {
      exts = &mod->exts;
      local_48 = &mod->typedefs;
      local_50 = &mod->rpcs;
      local_58 = &mod->notifs;
      local_60 = &mod->identities;
      local_68 = &mod->groupings;
      local_70 = &mod->features;
      local_78 = &mod->extensions;
      local_80 = &mod->deviations;
      local_88 = &mod->augments;
      siblings = &mod->data;
      local_40 = &mod->revs;
      local_90 = &mod->imports;
      local_98 = &mod->includes;
      uVar10 = 0;
      lVar5 = LY_STMT_NONE;
      do {
        stmt = in_stack_ffffffffffffff44;
        in_stack_ffffffffffffff44 = stmt;
        if ((int)stmt < 0xa0000) {
          if ((int)stmt < 0x800) {
            if ((int)stmt < 0x80) {
              if ((stmt - LY_STMT_NOTIFICATION < 0x40) &&
                 ((0x8000000080008001U >> ((ulong)(stmt - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0))
              {
LAB_0017ae74:
                uVar10 = 4;
              }
            }
            else if (((stmt == LY_STMT_AUGMENT) || (stmt == LY_STMT_CHOICE)) ||
                    (stmt == LY_STMT_CONTAINER)) goto LAB_0017ae74;
          }
          else if ((int)stmt < 0x4000) {
            if (((stmt == LY_STMT_GROUPING) || (stmt == LY_STMT_LEAF)) ||
               (stmt == LY_STMT_LEAF_LIST)) goto LAB_0017ae74;
          }
          else if ((int)stmt < 0x60000) {
            if ((stmt == LY_STMT_LIST) || (stmt == LY_STMT_USES)) goto LAB_0017ae74;
          }
          else if ((stmt == LY_STMT_CONTACT) || (stmt == LY_STMT_DESCRIPTION)) goto LAB_0017b0f5;
LAB_0017ae7a:
          plVar7 = mod;
          if ((int)stmt < 0xa0000) {
            if ((int)stmt < 0x800) {
              if ((int)stmt < 0x40) {
                if (stmt == LY_STMT_NOTIFICATION) {
                  LVar3 = parse_notif(ctx,(lysp_node *)0x0,local_58);
                }
                else {
                  if (stmt != LY_STMT_RPC) {
                    if (stmt != LY_STMT_ANYDATA) goto LAB_0017b4a3;
                    plVar2 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    if (1 < *(byte *)&plVar2[2].schema) goto LAB_0017afef;
                    plVar6 = (ly_ctx *)**(undefined8 **)plVar2;
                    format = 
                    "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                    ;
                    pcVar8 = "anydata";
                    goto LAB_0017b3fd;
                  }
                  LVar3 = parse_action(ctx,(lysp_node *)0x0,local_50);
                }
              }
              else if ((int)stmt < 0x200) {
                if (stmt == LY_STMT_ANYXML) {
LAB_0017afef:
                  LVar3 = parse_any(ctx,stmt,(lysp_node *)0x0,siblings);
                }
                else {
                  if (stmt != LY_STMT_AUGMENT) goto LAB_0017b4a3;
                  LVar3 = parse_augment(ctx,(lysp_node *)0x0,local_88);
                }
              }
              else if (stmt == LY_STMT_CHOICE) {
                LVar3 = parse_choice(ctx,(lysp_node *)0x0,siblings);
              }
              else {
                if (stmt != LY_STMT_CONTAINER) goto LAB_0017b4a3;
                LVar3 = parse_container(ctx,(lysp_node *)0x0,siblings);
              }
            }
            else if ((int)stmt < 0x4000) {
              if (stmt == LY_STMT_GROUPING) {
                LVar3 = parse_grouping(ctx,(lysp_node *)0x0,local_68);
              }
              else if (stmt == LY_STMT_LEAF) {
                LVar3 = parse_leaf(ctx,(lysp_node *)0x0,siblings);
              }
              else {
                if (stmt != LY_STMT_LEAF_LIST) goto LAB_0017b4a3;
                LVar3 = parse_leaflist(ctx,(lysp_node *)0x0,siblings);
              }
            }
            else {
              if (0x5ffff < (int)stmt) {
                if (stmt == LY_STMT_CONTACT) {
                  parent_stmt_index = (int)mod->mod + 0x38;
                  lVar5 = LY_STMT_CONTACT;
                }
                else {
                  if (stmt != LY_STMT_DESCRIPTION) goto LAB_0017b4a3;
                  parent_stmt_index = (int)mod->mod + 0x40;
                  lVar5 = LY_STMT_DESCRIPTION;
                  plVar7 = (lysp_module *)mod->mod->dsc;
                }
                goto LAB_0017b31b;
              }
              if (stmt == LY_STMT_LIST) {
                LVar3 = parse_list(ctx,(lysp_node *)0x0,siblings);
              }
              else {
                if (stmt != LY_STMT_USES) goto LAB_0017b4a3;
                LVar3 = parse_uses(ctx,(lysp_node *)0x0,siblings);
              }
            }
          }
          else if ((int)stmt < 0x1e0000) {
            if ((int)stmt < 0x100000) {
              if (stmt == LY_STMT_DEVIATION) {
                LVar3 = parse_deviation(ctx,local_80);
              }
              else if (stmt == LY_STMT_EXTENSION) {
                LVar3 = parse_extension(ctx,local_78);
              }
              else {
                if (stmt != LY_STMT_EXTENSION_INSTANCE) goto LAB_0017b4a3;
                LVar3 = parse_ext(ctx,local_a8,local_a0,mod,LY_STMT_MODULE,0,exts);
              }
            }
            else if ((int)stmt < 0x140000) {
              if (stmt == LY_STMT_FEATURE) {
                LVar3 = parse_feature(ctx,local_70);
              }
              else {
                if (stmt != LY_STMT_IDENTITY) goto LAB_0017b4a3;
                LVar3 = parse_identity(ctx,local_60);
              }
            }
            else if (stmt == LY_STMT_IMPORT) {
              LVar3 = parse_import(ctx,mod->mod->prefix,local_90);
            }
            else {
              if (stmt != LY_STMT_INCLUDE) goto LAB_0017b4a3;
              LVar3 = parse_include(ctx,mod->mod->name,local_98);
            }
          }
          else {
            if (0x26ffff < (int)stmt) {
              if ((int)stmt < 0x2f0000) {
                if (stmt == LY_STMT_REFERENCE) {
                  parent_stmt_index = (int)mod->mod + 0x48;
                  lVar5 = LY_STMT_REFERENCE;
                  plVar7 = (lysp_module *)mod->mod->ref;
                  goto LAB_0017b31b;
                }
                if (stmt == LY_STMT_REVISION) goto LAB_0017afa1;
              }
              else {
                if (stmt == LY_STMT_TYPEDEF) {
                  LVar3 = parse_typedef(ctx,(lysp_node *)0x0,local_48);
                  goto LAB_0017b329;
                }
                if (stmt == LY_STMT_YANG_VERSION) goto LAB_0017b1c0;
              }
LAB_0017b4a3:
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar6 = (ly_ctx *)0x0;
              }
              else {
                plVar6 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar8 = lyplg_ext_stmt2str(stmt);
              format = "Invalid keyword \"%s\" as a child of \"%s\".";
              pcVar9 = "module";
              code = LYVE_SYNTAX_YANG;
              goto LAB_0017b40b;
            }
            if (stmt == LY_STMT_NAMESPACE) {
              parent_stmt_index = (int)mod->mod + 0x18;
              lVar5 = LY_STMT_NAMESPACE;
LAB_0017b31b:
              value = (char **)0x2;
            }
            else {
              if (stmt == LY_STMT_ORGANIZATION) {
                parent_stmt_index = (int)mod->mod + 0x30;
                lVar5 = LY_STMT_ORGANIZATION;
                goto LAB_0017b31b;
              }
              if (stmt != LY_STMT_PREFIX) goto LAB_0017b4a3;
              plVar7 = (lysp_module *)mod->mod->prefix;
              parent_stmt_index = (int)mod->mod + 0x20;
              lVar5 = LY_STMT_PREFIX;
              value = (char **)0x0;
            }
            LVar3 = parse_text_field(ctx,plVar7,lVar5,parent_stmt_index,value,Y_IDENTIF_ARG,
                                     (uint16_t *)exts,
                                     (lysp_ext_instance **)CONCAT44(stmt,in_stack_ffffffffffffff40))
            ;
          }
        }
        else {
          if ((int)stmt < 0x1e0000) {
            if ((int)stmt < 0x120000) {
              if (((stmt == LY_STMT_DEVIATION) || (stmt == LY_STMT_EXTENSION)) ||
                 (stmt == LY_STMT_FEATURE)) goto LAB_0017ae74;
            }
            else {
              if (stmt == LY_STMT_IDENTITY) goto LAB_0017ae74;
              if (((stmt == LY_STMT_IMPORT) || (stmt == LY_STMT_INCLUDE)) &&
                 (bVar11 = 1 < uVar10, uVar10 = 1, bVar11)) goto LAB_0017b41c;
            }
            goto LAB_0017ae7a;
          }
          if ((int)stmt < 0x270000) {
            if (stmt != LY_STMT_NAMESPACE) {
              if (stmt == LY_STMT_ORGANIZATION) goto LAB_0017b0f5;
              if (stmt != LY_STMT_PREFIX) goto LAB_0017ae7a;
            }
            bVar11 = uVar10 == 0;
            uVar10 = 0;
            if (bVar11) goto LAB_0017ae7a;
LAB_0017b41c:
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar6 = (ly_ctx *)0x0;
            }
            else {
              plVar6 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
LAB_0017b43f:
            pcVar8 = lyplg_ext_stmt2str(stmt);
            pcVar9 = lyplg_ext_stmt2str(lVar5);
            format = "Invalid keyword \"%s\", it cannot appear after \"%s\".";
            code = LYVE_SYNTAX_YANG;
            goto LAB_0017b40b;
          }
          if ((int)stmt < 0x2f0000) {
            if (stmt == LY_STMT_REFERENCE) {
LAB_0017b0f5:
              bVar11 = 2 < uVar10;
              uVar10 = 2;
              if (bVar11) goto LAB_0017b41c;
              goto LAB_0017ae7a;
            }
            if (stmt != LY_STMT_REVISION) goto LAB_0017ae7a;
            bVar11 = 3 < uVar10;
            uVar10 = 3;
            if (bVar11) {
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar6 = (ly_ctx *)0x0;
              }
              else {
                plVar6 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              stmt = LY_STMT_REVISION;
              goto LAB_0017b43f;
            }
LAB_0017afa1:
            LVar3 = parse_revision(ctx,local_40);
          }
          else {
            if (stmt == LY_STMT_TYPEDEF) goto LAB_0017ae74;
            if (stmt != LY_STMT_YANG_VERSION) goto LAB_0017ae7a;
            bVar11 = uVar10 != 0;
            uVar10 = 0;
            if (bVar11) {
              if (ctx == (lysp_yang_ctx *)0x0) {
                plVar6 = (ly_ctx *)0x0;
              }
              else {
                plVar6 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              stmt = LY_STMT_YANG_VERSION;
              goto LAB_0017b43f;
            }
LAB_0017b1c0:
            LVar3 = parse_yangversion(ctx,mod);
          }
        }
LAB_0017b329:
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        LVar3 = get_keyword(ctx,(ly_stmt *)&stack0xffffffffffffff44,&local_a8,&local_a0);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        lVar5 = stmt;
      } while (in_stack_ffffffffffffff44 != LY_STMT_SYNTAX_RIGHT_BRACE);
      if ((*exts != (lysp_ext_instance *)0x0) &&
         (LVar3 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
         LVar3 != LY_SUCCESS)) {
        return LVar3;
      }
    }
  }
  plVar1 = mod->mod;
  if (plVar1->ns == (char *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
    pcVar8 = "namespace";
  }
  else {
    if (plVar1->prefix != (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
        plVar4 = ly_ctx_get_submodule_latest((ly_ctx *)0x0,plVar1->name);
        if (plVar4 == (lysp_submodule *)0x0) {
          return LY_SUCCESS;
        }
      }
      else {
        plVar4 = ly_ctx_get_submodule_latest
                           ((ly_ctx *)
                            **(undefined8 **)
                              (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                            plVar1->name);
        if (plVar4 == (lysp_submodule *)0x0) {
          return LY_SUCCESS;
        }
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Name collision between %s and %s of name \"%s\".";
      pcVar8 = "module";
      pcVar9 = "submodule";
      code = LYVE_SEMANTICS;
      goto LAB_0017b40b;
    }
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
    pcVar8 = "prefix";
  }
LAB_0017b3fd:
  pcVar9 = "module";
  code = LYVE_SYNTAX_YANG;
LAB_0017b40b:
  ly_vlog(plVar6,(char *)0x0,code,format,pcVar8,pcVar9);
  return LY_EVALID;
}

Assistant:

LY_ERR
parse_module(struct lysp_yang_ctx *ctx, struct lysp_module *mod)
{
    LY_ERR ret = 0;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw, prev_kw = 0;
    enum yang_module_stmt mod_stmt = Y_MOD_MODULE_HEADER;
    const struct lysp_submodule *dup;

    mod->is_submod = 0;

    /* module name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, mod->mod->name, word, word_len, ret, cleanup);

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {

#define CHECK_ORDER(SECTION) \
        if (mod_stmt > SECTION) {\
            LOGVAL_PARSER(ctx, LY_VCODE_INORD, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(prev_kw)); return LY_EVALID;\
        } mod_stmt = SECTION

        switch (kw) {
        /* module header */
        case LY_STMT_NAMESPACE:
        case LY_STMT_PREFIX:
            CHECK_ORDER(Y_MOD_MODULE_HEADER);
            break;
        case LY_STMT_YANG_VERSION:
            CHECK_ORDER(Y_MOD_MODULE_HEADER);
            break;
        /* linkage */
        case LY_STMT_INCLUDE:
        case LY_STMT_IMPORT:
            CHECK_ORDER(Y_MOD_LINKAGE);
            break;
        /* meta */
        case LY_STMT_ORGANIZATION:
        case LY_STMT_CONTACT:
        case LY_STMT_DESCRIPTION:
        case LY_STMT_REFERENCE:
            CHECK_ORDER(Y_MOD_META);
            break;

        /* revision */
        case LY_STMT_REVISION:
            CHECK_ORDER(Y_MOD_REVISION);
            break;
        /* body */
        case LY_STMT_ANYDATA:
        case LY_STMT_ANYXML:
        case LY_STMT_AUGMENT:
        case LY_STMT_CHOICE:
        case LY_STMT_CONTAINER:
        case LY_STMT_DEVIATION:
        case LY_STMT_EXTENSION:
        case LY_STMT_FEATURE:
        case LY_STMT_GROUPING:
        case LY_STMT_IDENTITY:
        case LY_STMT_LEAF:
        case LY_STMT_LEAF_LIST:
        case LY_STMT_LIST:
        case LY_STMT_NOTIFICATION:
        case LY_STMT_RPC:
        case LY_STMT_TYPEDEF:
        case LY_STMT_USES:
            mod_stmt = Y_MOD_BODY;
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            /* no place in the statement order defined */
            break;
        default:
            /* error handled in the next switch */
            break;
        }
#undef CHECK_ORDER

        prev_kw = kw;
        switch (kw) {
        /* module header */
        case LY_STMT_YANG_VERSION:
            LY_CHECK_RET(parse_yangversion(ctx, mod));
            break;
        case LY_STMT_NAMESPACE:
            LY_CHECK_RET(parse_text_field(ctx, mod, LY_STMT_NAMESPACE, 0, &mod->mod->ns, Y_STR_ARG, NULL, &mod->exts));
            break;
        case LY_STMT_PREFIX:
            LY_CHECK_RET(parse_text_field(ctx, mod->mod->prefix, LY_STMT_PREFIX, 0, &mod->mod->prefix, Y_IDENTIF_ARG,
                    NULL, &mod->exts));
            break;

        /* linkage */
        case LY_STMT_INCLUDE:
            LY_CHECK_RET(parse_include(ctx, mod->mod->name, &mod->includes));
            break;
        case LY_STMT_IMPORT:
            LY_CHECK_RET(parse_import(ctx, mod->mod->prefix, &mod->imports));
            break;

        /* meta */
        case LY_STMT_ORGANIZATION:
            LY_CHECK_RET(parse_text_field(ctx, mod, LY_STMT_ORGANIZATION, 0, &mod->mod->org, Y_STR_ARG, NULL, &mod->exts));
            break;
        case LY_STMT_CONTACT:
            LY_CHECK_RET(parse_text_field(ctx, mod, LY_STMT_CONTACT, 0, &mod->mod->contact, Y_STR_ARG, NULL, &mod->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, mod->mod->dsc, LY_STMT_DESCRIPTION, 0, &mod->mod->dsc, Y_STR_ARG, NULL,
                    &mod->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, mod->mod->ref, LY_STMT_REFERENCE, 0, &mod->mod->ref, Y_STR_ARG, NULL,
                    &mod->exts));
            break;

        /* revision */
        case LY_STMT_REVISION:
            LY_CHECK_RET(parse_revision(ctx, &mod->revs));
            break;

        /* body */
        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "module");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(parse_any(ctx, kw, NULL, &mod->data));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(parse_choice(ctx, NULL, &mod->data));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(parse_container(ctx, NULL, &mod->data));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(parse_leaf(ctx, NULL, &mod->data));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(parse_leaflist(ctx, NULL, &mod->data));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(parse_list(ctx, NULL, &mod->data));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(parse_uses(ctx, NULL, &mod->data));
            break;

        case LY_STMT_AUGMENT:
            LY_CHECK_RET(parse_augment(ctx, NULL, &mod->augments));
            break;
        case LY_STMT_DEVIATION:
            LY_CHECK_RET(parse_deviation(ctx, &mod->deviations));
            break;
        case LY_STMT_EXTENSION:
            LY_CHECK_RET(parse_extension(ctx, &mod->extensions));
            break;
        case LY_STMT_FEATURE:
            LY_CHECK_RET(parse_feature(ctx, &mod->features));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(parse_grouping(ctx, NULL, &mod->groupings));
            break;
        case LY_STMT_IDENTITY:
            LY_CHECK_RET(parse_identity(ctx, &mod->identities));
            break;
        case LY_STMT_NOTIFICATION:
            LY_CHECK_RET(parse_notif(ctx, NULL, &mod->notifs));
            break;
        case LY_STMT_RPC:
            LY_CHECK_RET(parse_action(ctx, NULL, &mod->rpcs));
            break;
        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(parse_typedef(ctx, NULL, &mod->typedefs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, mod, LY_STMT_MODULE, 0, &mod->exts));
            break;

        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "module");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, mod->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!mod->mod->ns) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "namespace", "module");
        return LY_EVALID;
    } else if (!mod->mod->prefix) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "prefix", "module");
        return LY_EVALID;
    }

    /* submodules share the namespace with the module names, so there must not be
     * a submodule of the same name in the context, no need for revision matching */
    dup = ly_ctx_get_submodule_latest(PARSER_CTX(ctx), mod->mod->name);
    if (dup) {
        LOGVAL_PARSER(ctx, LY_VCODE_NAME2_COL, "module", "submodule", mod->mod->name);
        return LY_EVALID;
    }

cleanup:
    return ret;
}